

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3AddCheckConstraint(Parse *pParse,Expr *pCheckExpr)

{
  Table *pTVar1;
  ExprList *pEVar2;
  Table *pTab;
  Expr *pCheckExpr_local;
  Parse *pParse_local;
  
  pTVar1 = pParse->pNewTable;
  if ((pTVar1 == (Table *)0x0) || (pParse->declareVtab != '\0')) {
    sqlite3ExprDelete(pParse->db,pCheckExpr);
  }
  else {
    pEVar2 = sqlite3ExprListAppend(pParse,pTVar1->pCheck,pCheckExpr);
    pTVar1->pCheck = pEVar2;
    if ((pParse->constraintName).n != 0) {
      sqlite3ExprListSetName(pParse,pTVar1->pCheck,&pParse->constraintName,1);
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AddCheckConstraint(
  Parse *pParse,    /* Parsing context */
  Expr *pCheckExpr  /* The check expression */
){
#ifndef SQLITE_OMIT_CHECK
  Table *pTab = pParse->pNewTable;
  if( pTab && !IN_DECLARE_VTAB ){
    pTab->pCheck = sqlite3ExprListAppend(pParse, pTab->pCheck, pCheckExpr);
    if( pParse->constraintName.n ){
      sqlite3ExprListSetName(pParse, pTab->pCheck, &pParse->constraintName, 1);
    }
  }else
#endif
  {
    sqlite3ExprDelete(pParse->db, pCheckExpr);
  }
}